

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O2

int copy_value(adiak_value_t *target,adiak_datatype_t *datatype,void *ptr)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  adiak_value_t __s;
  adiak_value_t *paVar4;
  undefined8 *puVar5;
  ulong uVar6;
  long lVar7;
  adiak_value_t *target_00;
  ulong uVar8;
  uchar *array_base;
  
  iVar2 = -1;
  switch(datatype->dtype) {
  case adiak_long:
  case adiak_ulong:
  case adiak_date:
  case adiak_longlong:
  case adiak_ulonglong:
    __s = *ptr;
    goto LAB_001057e8;
  case adiak_int:
  case adiak_uint:
    target->v_int = *ptr;
    return 4;
  case adiak_double:
    *target = *ptr;
    break;
  case adiak_timeval:
    puVar5 = (undefined8 *)ptr;
    if (datatype->is_reference == 0) {
      puVar5 = (undefined8 *)malloc(0x10);
      uVar1 = *(undefined8 *)((long)ptr + 8);
      *puVar5 = *ptr;
      puVar5[1] = uVar1;
    }
    target->v_ptr = puVar5;
    break;
  case adiak_version:
  case adiak_string:
  case adiak_catstring:
  case adiak_path:
    __s = *ptr;
    if (datatype->is_reference == 0) {
      __s.v_long = (long)strdup(__s.v_long);
    }
LAB_001057e8:
    *target = __s;
    break;
  case adiak_range:
  case adiak_set:
  case adiak_list:
  case adiak_tuple:
    if (datatype->is_reference != 0) {
      target->v_ptr = ptr;
      iVar2 = calc_size(datatype);
      return iVar2;
    }
    uVar8 = (ulong)datatype->num_elements;
    paVar4 = (adiak_value_t *)malloc(uVar8 << 3);
    uVar6 = 0;
    iVar2 = 0;
    target_00 = paVar4;
    for (lVar7 = 0; lVar7 < (int)uVar8; lVar7 = lVar7 + 1) {
      iVar3 = copy_value(target_00,datatype->subtype[uVar6],(void *)((long)iVar2 + (long)ptr));
      if (iVar3 == -1) {
        return -1;
      }
      iVar2 = iVar2 + iVar3;
      uVar8 = (ulong)(uint)datatype->num_elements;
      uVar6 = (ulong)((int)uVar6 + (uint)(datatype->dtype == adiak_tuple));
      target_00 = target_00 + 1;
    }
    target->v_subval = paVar4;
  default:
    goto switchD_001057cf_default;
  }
  iVar2 = 8;
switchD_001057cf_default:
  return iVar2;
}

Assistant:

static int copy_value(adiak_value_t *target, adiak_datatype_t *datatype, void *ptr) {
   int bytes_read = 0, result, type_index = 0, i;
   adiak_value_t *newvalues;
   switch (datatype->dtype) {
      case adiak_type_unset:
         return -1;
      case adiak_long:
      case adiak_ulong:
      case adiak_date:
         target->v_long = *((long *) ptr);
         return sizeof(long);
      case adiak_longlong:
      case adiak_ulonglong:
         target->v_longlong = *((long long *) ptr);
         return sizeof(long long);
      case adiak_int:
      case adiak_uint:
         target->v_int = *((int *) ptr);
         return sizeof(int);
      case adiak_double:
         target->v_double= *((double *) ptr);
         return sizeof(double);
      case adiak_timeval: {
         struct timeval* v = (struct timeval*) ptr;
         if (!datatype->is_reference) {
             v = (struct timeval *) malloc(sizeof(struct timeval));
            *v = *(struct timeval *) ptr;
         }
         target->v_ptr = v;
         return sizeof(struct timeval *);
      }
      case adiak_version:
      case adiak_string:
      case adiak_catstring:
      case adiak_path:
         {
            char* sptr = (char*) *((void**) ptr);
            target->v_ptr = (datatype->is_reference ? sptr : strdup(sptr));
         }
         return sizeof(char *);
      case adiak_range:
      case adiak_set:
      case adiak_list:
      case adiak_tuple:
         if (datatype->is_reference) {
            target->v_ptr = ptr;
            return calc_size(datatype);
         }
         newvalues = (adiak_value_t *) malloc(sizeof(adiak_value_t) * datatype->num_elements);
         for (i = 0; i < datatype->num_elements; i++) {
            unsigned char *array_base = (unsigned char *) ptr;
            result = copy_value(newvalues+i, datatype->subtype[type_index], array_base + bytes_read);
            if (result == -1)
               return -1;
            bytes_read += result;
            if (datatype->dtype == adiak_tuple)
               type_index++;
         }
         target->v_subval = newvalues;
         return bytes_read;
   }
   return -1;
}